

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::Parameter::Parameter(Parameter *this,Parameter *param_1)

{
  pointer pdVar1;
  bool bVar2;
  
  bVar2 = param_1->has_number_value;
  this->bool_value = param_1->bool_value;
  this->has_number_value = bVar2;
  std::__cxx11::string::string((string *)&this->string_value,(string *)&param_1->string_value);
  pdVar1 = (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar1;
  (this->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->number_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->json_double_value)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->json_double_value)._M_t._M_impl.super__Rb_tree_header);
  this->number_value = param_1->number_value;
  return;
}

Assistant:

Parameter() = default;